

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_2d1;
  bbox2d bbox;
  string local_2b8;
  string local_298;
  string local_278;
  c_polygon poly;
  bbox2d_problem local_1e8;
  undefined4 local_198;
  obb bbox_WXH;
  obb min_peri_bbox;
  obb min_area_bbox;
  contained_bbox local_b8;
  bbox2d_problem local_60;
  undefined4 local_10;
  
  if (argc == 2) {
    poly.super_c_plylist.super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&poly;
    poly.super_c_plylist.super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    _M_size = 0;
    poly.super_c_plylist.center.v[0] = 0.0;
    poly.super_c_plylist.center.v[1] = 0.0;
    poly.super_c_plylist.box[0] = 0.0;
    poly.super_c_plylist.box[1] = 0.0;
    poly.super_c_plylist.box[2]._0_2_ = 0;
    poly.super_c_plylist.box[2]._2_6_ = 0;
    poly.super_c_plylist.box[3]._0_2_ = 0;
    poly.super_c_plylist._66_8_ = 0;
    poly.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    poly.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    poly.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    poly.area = 0.0;
    poly.arclength = 0.0;
    poly.super_c_plylist.super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         poly.super_c_plylist.
         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    std::__cxx11::string::string((string *)&local_1e8,argv[1],(allocator *)&local_60);
    createPoly((string *)&local_1e8,&poly);
    std::__cxx11::string::~string((string *)&local_1e8);
    masc::polygon::bbox2d::bbox2d(&bbox,&poly);
    local_1e8.m_solution.corners[3].v[0] = 0.0;
    local_1e8.m_solution.corners[3].v[1] = 0.0;
    local_1e8.m_solution.corners[2].v[0] = 0.0;
    local_1e8.m_solution.corners[2].v[1] = 0.0;
    local_1e8.m_solution.corners[1].v[0] = 0.0;
    local_1e8.m_solution.corners[1].v[1] = 0.0;
    local_1e8.m_solution.corners[0].v[0] = 0.0;
    local_1e8.m_solution.corners[0].v[1] = 0.0;
    local_1e8.m_solution.width = 3.4028235e+38;
    local_1e8.m_solution.height = 3.4028235e+38;
    local_1e8._vptr_bbox2d_problem = (_func_int **)&PTR_solved_00112bf0;
    local_198 = 0x7f7fffff;
    masc::polygon::bbox2d::build(&min_area_bbox,&bbox,&local_1e8);
    poVar3 = std::operator<<((ostream *)&std::cout,"BBox with min area: ");
    poVar3 = masc::polygon::operator<<(poVar3,&min_area_bbox);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::string((string *)&local_278,"min_area_bbox.svg",(allocator *)&local_60);
    masc::polygon::saveSVG
              (&local_278,
               (c_ply *)(poly.super_c_plylist.
                         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                         ._M_impl._M_node.super__List_node_base._M_next + 1),&min_area_bbox);
    std::__cxx11::string::~string((string *)&local_278);
    local_60.m_solution.corners[3].v[0] = 0.0;
    local_60.m_solution.corners[3].v[1] = 0.0;
    local_60.m_solution.corners[2].v[0] = 0.0;
    local_60.m_solution.corners[2].v[1] = 0.0;
    local_60.m_solution.corners[1].v[0] = 0.0;
    local_60.m_solution.corners[1].v[1] = 0.0;
    local_60.m_solution.corners[0].v[0] = 0.0;
    local_60.m_solution.corners[0].v[1] = 0.0;
    local_60.m_solution.width = 3.4028235e+38;
    local_60.m_solution.height = 3.4028235e+38;
    local_60._vptr_bbox2d_problem = (_func_int **)&PTR_solved_00112c20;
    local_10 = 0x7f7fffff;
    masc::polygon::bbox2d::build(&min_peri_bbox,&bbox,&local_60);
    poVar3 = std::operator<<((ostream *)&std::cout,"BBox with min perimeter: ");
    poVar3 = masc::polygon::operator<<(poVar3,&min_peri_bbox);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::string
              ((string *)&local_298,"min_perimeter_bbox.svg",(allocator *)&local_b8);
    masc::polygon::saveSVG
              (&local_298,
               (c_ply *)(poly.super_c_plylist.
                         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                         ._M_impl._M_node.super__List_node_base._M_next + 1),&min_peri_bbox);
    std::__cxx11::string::~string((string *)&local_298);
    local_b8.super_bbox2d_problem.m_solution.corners[3].v[0] = 0.0;
    local_b8.super_bbox2d_problem.m_solution.corners[3].v[1] = 0.0;
    local_b8.super_bbox2d_problem.m_solution.corners[2].v[0] = 0.0;
    local_b8.super_bbox2d_problem.m_solution.corners[2].v[1] = 0.0;
    local_b8.super_bbox2d_problem.m_solution.corners[1].v[0] = 0.0;
    local_b8.super_bbox2d_problem.m_solution.corners[1].v[1] = 0.0;
    local_b8.super_bbox2d_problem.m_solution.corners[0].v[0] = 0.0;
    local_b8.super_bbox2d_problem.m_solution.corners[0].v[1] = 0.0;
    local_b8.super_bbox2d_problem._vptr_bbox2d_problem = (_func_int **)&PTR_solved_00112c50;
    local_b8.super_bbox2d_problem.m_solution.width = 3.4028235e+38;
    local_b8.super_bbox2d_problem.m_solution.height = 3.4028235e+38;
    local_b8.m_width = 28.0;
    local_b8.m_height = 28.0;
    masc::polygon::bbox2d::build(&bbox_WXH,&bbox,&local_b8.super_bbox2d_problem);
    bVar1 = masc::polygon::contained_bbox::solved(&local_b8,&bbox_WXH);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"BBox contained in ");
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::operator<<(poVar3,"X");
      poVar3 = std::ostream::_M_insert<double>(28.0);
      poVar3 = std::operator<<(poVar3," square: ");
      poVar3 = masc::polygon::operator<<(poVar3,&bbox_WXH);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::string((string *)&local_2b8,"contained_bbox.svg",&local_2d1);
      masc::polygon::saveSVG
                (&local_2b8,
                 (c_ply *)(poly.super_c_plylist.
                           super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                           super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                           ._M_impl._M_node.super__List_node_base._M_next + 1),&bbox_WXH);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    else {
      std::operator<<((ostream *)&std::cerr,"! Error: Cannot find a bounding box that fits into ");
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::operator<<(poVar3,"X");
      poVar3 = std::ostream::_M_insert<double>(28.0);
      poVar3 = std::operator<<(poVar3," square");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::_Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
    ~_Vector_base((_Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                   *)&bbox);
    masc::polygon::c_polygon::~c_polygon(&poly);
    iVar2 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    poVar3 = std::operator<<(poVar3," polygon");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char ** argv)
{
  if(argc!=2)
  {
    cerr<<"Usage: "<<argv[0]<<" polygon"<<endl;
    return 1;
  }

  //create polygon
  masc::polygon::c_polygon poly;
  createPoly(argv[1],poly);

  //create bbox of the polygon
  masc::polygon::bbox2d bbox(poly);

  //create min-area bbox
  masc::polygon::min_area_bbox p1;
  masc::polygon::obb min_area_bbox = bbox.build(p1);
  cout<<"BBox with min area: "<<min_area_bbox<<endl;
  saveSVG("min_area_bbox.svg",poly.front(),min_area_bbox);

  //build min-perimeter box
  masc::polygon::min_perimeter_bbox p2;
  masc::polygon::obb min_peri_bbox = bbox.build(p2);
  cout<<"BBox with min perimeter: "<<min_peri_bbox<<endl;
  saveSVG("min_perimeter_bbox.svg",poly.front(),min_peri_bbox);

  //build a box that fits into 13X13 square
  float W=28, H=28;
  masc::polygon::contained_bbox p3(W,H);
  masc::polygon::obb bbox_WXH = bbox.build(p3);
  if(p3.solved(bbox_WXH)==false)
    cerr<<"! Error: Cannot find a bounding box that fits into "<<W<<"X"<<H<<" square"<<endl;
  else
  {
    cout<<"BBox contained in "<<W<<"X"<<H<<" square: "<<bbox_WXH<<endl;
    saveSVG("contained_bbox.svg",poly.front(),bbox_WXH);
  }

  return 0;
}